

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

double __thiscall DynamicHistogram<double>::total(DynamicHistogram<double> *this)

{
  int iVar1;
  double *pdVar2;
  runtime_error *this_00;
  double dVar3;
  
  iVar1 = (*this->_vptr_DynamicHistogram[2])();
  if ((char)iVar1 != '\0') {
    dVar3 = 0.0;
    for (pdVar2 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar2 != (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
      dVar3 = dVar3 + *pdVar2;
    }
    return dVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"DynamicHistogram::total - Histogram could not be initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double
    total()
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::total - Histogram could not be initialized.");
        double sum = std::accumulate(this->_frequencies.begin(), this->_frequencies.end(), 0.0);
        return sum;
    }